

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmem.h
# Opt level: O1

void __thiscall mappedmem::mappedmem(mappedmem *this,int f,uint64_t start,uint64_t end,int mmapmode)

{
  int __v;
  ulong uVar1;
  uint8_t *puVar2;
  system_error *this_00;
  int *piVar3;
  error_category *__ecat;
  ulong uVar4;
  size_t __len;
  
  uVar1 = sysconf(0x1e);
  uVar4 = 0x1000;
  if (0x1000 < (int)uVar1) {
    uVar4 = uVar1 & 0xffffffff;
  }
  uVar1 = -uVar4 & start;
  __len = ((uVar4 - 1 | end - 1) + 1) - uVar1;
  this->phys_length = __len;
  this->length = end - start;
  this->dataofs = start - uVar1;
  if (__len == 0) {
    this->pmem = (uint8_t *)0x0;
  }
  else {
    puVar2 = (uint8_t *)mmap((void *)0x0,__len,mmapmode,1,f,uVar1);
    this->pmem = puVar2;
    if (puVar2 == (uint8_t *)0xffffffffffffffff) {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar3 = __errno_location();
      __v = *piVar3;
      __ecat = (error_category *)std::_V2::generic_category();
      std::system_error::system_error(this_00,__v,__ecat,"mmap");
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  return;
}

Assistant:

mappedmem(int f, uint64_t start, uint64_t end, int mmapmode= PROT_READ|PROT_WRITE)
    {
        uint64_t pagesize= std::max(0x1000, (int)sysconf(_SC_PAGE_SIZE));

        uint64_t phys_start= round_down(start, pagesize);
        uint64_t phys_end= round_up(end, pagesize);

        phys_length= phys_end - phys_start;
        length = end - start;
        dataofs= start - phys_start;

        if (phys_length==0) {
            pmem = NULL;
            return;
        }
        pmem= (uint8_t*)mymmap(NULL, phys_length, mmapmode, MAP_SHARED, f, mmapoffset(phys_start));
        if (pmem==MAP_FAILED)
            throw std::system_error(errno, std::generic_category(), "mmap");
    }